

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

bool __thiscall
sf::priv::WindowImplX11::checkXRandR(WindowImplX11 *this,int *xRandRMajor,int *xRandRMinor)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  int version;
  undefined1 local_1c [4];
  
  iVar1 = XQueryExtension(this->m_display,"RANDR",local_1c,local_1c,local_1c);
  if (iVar1 == 0) {
    pcVar3 = "XRandR extension is not supported";
  }
  else {
    iVar1 = XRRQueryVersion(this->m_display,xRandRMajor,xRandRMinor);
    pcVar3 = "XRandR is too old";
    if ((iVar1 != 0) && (0 < *xRandRMajor)) {
      if (*xRandRMajor != 1) {
        return true;
      }
      if (1 < *xRandRMinor) {
        return true;
      }
    }
  }
  poVar2 = err();
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return false;
}

Assistant:

bool WindowImplX11::checkXRandR(int& xRandRMajor, int& xRandRMinor)
{
    // Check if the XRandR extension is present
    int version;
    if (!XQueryExtension(m_display, "RANDR", &version, &version, &version))
    {
        err() << "XRandR extension is not supported" << std::endl;
        return false;
    }

    // Check XRandR version, 1.2 required
    if (!XRRQueryVersion(m_display, &xRandRMajor, &xRandRMinor) || xRandRMajor < 1 || (xRandRMajor == 1 && xRandRMinor < 2 ))
    {
        err() << "XRandR is too old" << std::endl;
        return false;
    }

    return true;
}